

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

int json_value_equals(JSON_Value *a,JSON_Value *b)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  JSON_Value *pJVar4;
  JSON_Value *pJVar5;
  size_t sVar6;
  unsigned_long *puVar7;
  JSON_Value_Value *pJVar8;
  JSON_Object *pJVar9;
  JSON_Array *pJVar10;
  ulong uVar11;
  JSON_Value_Value *pJVar12;
  JSON_Value_Value *pJVar13;
  size_t sVar14;
  JSON_Object *object;
  char *name;
  unsigned_long *puVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  
  iVar2 = -1;
  iVar3 = -1;
  if (a != (JSON_Value *)0x0) {
    iVar3 = a->type;
  }
  if (b != (JSON_Value *)0x0) {
    iVar2 = b->type;
  }
  if (iVar3 != iVar2) {
    return 0;
  }
  uVar1 = 1;
  switch(iVar3) {
  case 2:
    if (a == (JSON_Value *)0x0) {
      bVar16 = false;
    }
    else {
      bVar16 = a->type == 2;
    }
    pJVar8 = (JSON_Value_Value *)0x0;
    pJVar13 = &a->value;
    if (bVar16 == false) {
      pJVar13 = pJVar8;
    }
    if (b != (JSON_Value *)0x0) {
      pJVar8 = (JSON_Value_Value *)(ulong)(b->type == 2);
    }
    pJVar12 = &b->value;
    if ((byte)pJVar8 == 0) {
      pJVar12 = (JSON_Value_Value *)0x0;
    }
    if ((bVar16 & (byte)pJVar8) != 1) {
      return 0;
    }
    if ((pJVar13->string).length != (pJVar12->string).length) {
      return 0;
    }
    iVar3 = bcmp((pJVar13->string).chars,(pJVar12->string).chars,(pJVar13->string).length);
    bVar16 = iVar3 == 0;
    break;
  case 3:
    dVar17 = 0.0;
    dVar18 = 0.0;
    if ((a != (JSON_Value *)0x0) && (a->type == 3)) {
      dVar18 = (a->value).number;
    }
    if ((b != (JSON_Value *)0x0) && (b->type == 3)) {
      dVar17 = (b->value).number;
    }
    return (uint)(ABS(dVar18 - dVar17) < 1e-06);
  case 4:
    if ((a == (JSON_Value *)0x0) || (a->type != 4)) {
      pJVar9 = (JSON_Object *)0x0;
    }
    else {
      pJVar9 = (a->value).object;
    }
    if ((b == (JSON_Value *)0x0) || (b->type != 4)) {
      object = (JSON_Object *)0x0;
    }
    else {
      object = (b->value).object;
    }
    if (pJVar9 == (JSON_Object *)0x0) {
      sVar14 = 0;
    }
    else {
      sVar14 = pJVar9->count;
    }
    if (object == (JSON_Object *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = object->count;
    }
    if (sVar14 != sVar6) {
      return 0;
    }
    if (sVar14 == 0) {
      return 1;
    }
    uVar11 = 0;
    while( true ) {
      if ((pJVar9 == (JSON_Object *)0x0) || (pJVar9->count <= uVar11)) {
        name = (char *)0x0;
      }
      else {
        name = pJVar9->names[uVar11];
      }
      pJVar4 = json_object_get_value(pJVar9,name);
      pJVar5 = json_object_get_value(object,name);
      iVar3 = json_value_equals(pJVar4,pJVar5);
      uVar1 = (uint)(iVar3 != 0);
      if (iVar3 == 0) break;
      bVar16 = sVar14 - 1 == uVar11;
      uVar11 = uVar11 + 1;
      if (bVar16) {
        return uVar1;
      }
    }
    return uVar1;
  case 5:
    if ((a == (JSON_Value *)0x0) || (a->type != 5)) {
      pJVar10 = (JSON_Array *)0x0;
    }
    else {
      pJVar10 = (a->value).array;
    }
    if ((b == (JSON_Value *)0x0) || (b->type != 5)) {
      pJVar9 = (JSON_Object *)0x0;
    }
    else {
      pJVar9 = (b->value).object;
    }
    if (pJVar10 == (JSON_Array *)0x0) {
      puVar15 = (unsigned_long *)0x0;
    }
    else {
      puVar15 = (unsigned_long *)pJVar10->count;
    }
    if (pJVar9 == (JSON_Object *)0x0) {
      puVar7 = (unsigned_long *)0x0;
    }
    else {
      puVar7 = pJVar9->hashes;
    }
    if (puVar15 != puVar7) {
      return 0;
    }
    if (puVar15 == (unsigned_long *)0x0) {
      return 1;
    }
    puVar7 = (unsigned_long *)0x0;
    while( true ) {
      if ((pJVar10 == (JSON_Array *)0x0) || ((unsigned_long *)pJVar10->count <= puVar7)) {
        pJVar4 = (JSON_Value *)0x0;
      }
      else {
        pJVar4 = pJVar10->items[(long)puVar7];
      }
      if ((pJVar9 == (JSON_Object *)0x0) || (pJVar9->hashes <= puVar7)) {
        pJVar5 = (JSON_Value *)0x0;
      }
      else {
        pJVar5 = (JSON_Value *)pJVar9->cells[(long)puVar7];
      }
      iVar3 = json_value_equals(pJVar4,pJVar5);
      uVar1 = (uint)(iVar3 != 0);
      if (iVar3 == 0) break;
      bVar16 = (unsigned_long *)((long)puVar15 + -1) == puVar7;
      puVar7 = (unsigned_long *)((long)puVar7 + 1);
      if (bVar16) {
        return uVar1;
      }
    }
    return uVar1;
  case 6:
    iVar2 = -1;
    iVar3 = -1;
    if ((a != (JSON_Value *)0x0) && (a->type == 6)) {
      iVar3 = (a->value).boolean;
    }
    if ((b != (JSON_Value *)0x0) && (b->type == 6)) {
      iVar2 = (b->value).boolean;
    }
    bVar16 = iVar3 == iVar2;
    break;
  default:
    goto switchD_00179ef6_default;
  }
  uVar1 = (uint)bVar16;
switchD_00179ef6_default:
  return uVar1;
}

Assistant:

int json_value_equals(const JSON_Value *a, const JSON_Value *b) {
    JSON_Object *a_object = NULL, *b_object = NULL;
    JSON_Array *a_array = NULL, *b_array = NULL;
    const JSON_String *a_string = NULL, *b_string = NULL;
    const char *key = NULL;
    size_t a_count = 0, b_count = 0, i = 0;
    JSON_Value_Type a_type, b_type;
    a_type = json_value_get_type(a);
    b_type = json_value_get_type(b);
    if (a_type != b_type) {
        return PARSON_FALSE;
    }
    switch (a_type) {
        case JSONArray:
            a_array = json_value_get_array(a);
            b_array = json_value_get_array(b);
            a_count = json_array_get_count(a_array);
            b_count = json_array_get_count(b_array);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                if (!json_value_equals(json_array_get_value(a_array, i),
                                       json_array_get_value(b_array, i))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONObject:
            a_object = json_value_get_object(a);
            b_object = json_value_get_object(b);
            a_count = json_object_get_count(a_object);
            b_count = json_object_get_count(b_object);
            if (a_count != b_count) {
                return PARSON_FALSE;
            }
            for (i = 0; i < a_count; i++) {
                key = json_object_get_name(a_object, i);
                if (!json_value_equals(json_object_get_value(a_object, key),
                                       json_object_get_value(b_object, key))) {
                    return PARSON_FALSE;
                }
            }
            return PARSON_TRUE;
        case JSONString:
            a_string = json_value_get_string_desc(a);
            b_string = json_value_get_string_desc(b);
            if (a_string == NULL || b_string == NULL) {
                return PARSON_FALSE; /* shouldn't happen */
            }
            return a_string->length == b_string->length &&
                   memcmp(a_string->chars, b_string->chars, a_string->length) == 0;
        case JSONBoolean:
            return json_value_get_boolean(a) == json_value_get_boolean(b);
        case JSONNumber:
            return fabs(json_value_get_number(a) - json_value_get_number(b)) < 0.000001; /* EPSILON */
        case JSONError:
            return PARSON_TRUE;
        case JSONNull:
            return PARSON_TRUE;
        default:
            return PARSON_TRUE;
    }
}